

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

QueryCounters * __thiscall
DatabaseSnapshot::execute
          (DatabaseSnapshot *this,Query *query,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *datasets,Task *task,ResultWriter *out)

{
  bool bVar1;
  runtime_error *this_00;
  TaskSpec *this_01;
  DatabaseSnapshot *in_RSI;
  QueryCounters *in_RDI;
  Task *in_R9;
  OnDiskDataset *ds;
  iterator __end1;
  iterator __begin1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1;
  OnDiskDataset *dsptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dsname;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> datasets_to_query;
  QueryCounters *in_stack_00000138;
  ResultWriter *in_stack_00000140;
  Query *in_stack_00000148;
  OnDiskDataset *in_stack_00000150;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  OnDiskDataset **in_stack_ffffffffffffff28;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_ffffffffffffff30;
  OnDiskDataset *in_stack_ffffffffffffff40;
  OnDiskDataset *in_stack_ffffffffffffff48;
  QueryCounters *this_02;
  DatabaseSnapshot *in_stack_ffffffffffffff68;
  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_88;
  undefined1 *local_80;
  OnDiskDataset *local_78;
  reference local_70;
  _Self local_68;
  _Self local_60 [3];
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_ffffffffffffffb8;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_ffffffffffffffc0;
  
  this_02 = in_RDI;
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)0x17c10b);
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x17c118);
  if (bVar1) {
    in_stack_ffffffffffffff48 = (OnDiskDataset *)get_datasets(in_RSI);
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x17c16e);
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::reserve
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)this_02,
               (size_type)in_stack_ffffffffffffff48);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_ffffffffffffff18);
    local_68._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_ffffffffffffff18);
    while (bVar1 = std::operator!=(local_60,&local_68), bVar1) {
      local_70 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x17c1e5);
      in_stack_ffffffffffffff40 = find_dataset(in_stack_ffffffffffffff68,(string *)in_RSI);
      local_78 = in_stack_ffffffffffffff40;
      if (in_stack_ffffffffffffff40 == (OnDiskDataset *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Invalid dataset specified in query");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
      emplace_back<OnDiskDataset_const*&>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    }
  }
  this_01 = Task::spec(in_R9);
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
             &stack0xffffffffffffffc0);
  TaskSpec::estimate_work
            ((TaskSpec *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (uint64_t)in_stack_ffffffffffffff18);
  QueryCounters::QueryCounters
            ((QueryCounters *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  local_80 = &stack0xffffffffffffffc0;
  local_88._M_current =
       (OnDiskDataset **)
       std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                 ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                  in_stack_ffffffffffffff18);
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
             in_stack_ffffffffffffff18);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                            (__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                             *)in_stack_ffffffffffffff18), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
    ::operator*(&local_88);
    Task::spec(in_R9);
    TaskSpec::add_progress
              ((TaskSpec *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (uint64_t)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff27 =
         OnDiskDataset::has_all_taints
                   (in_stack_ffffffffffffff48,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff40);
    if ((bool)in_stack_ffffffffffffff27) {
      OnDiskDataset::execute
                (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138);
    }
    __gnu_cxx::
    __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
    ::operator++(&local_88);
  }
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)this_01);
  return in_RDI;
}

Assistant:

QueryCounters DatabaseSnapshot::execute(const Query &query,
                                        const std::set<std::string> &taints,
                                        const std::set<std::string> &datasets,
                                        Task *task, ResultWriter *out) const {
    std::vector<const OnDiskDataset *> datasets_to_query;
    if (datasets.empty()) {
        // No datasets selected explicitly == query everything.
        datasets_to_query = get_datasets();
    } else {
        datasets_to_query.reserve(datasets.size());
        for (const auto &dsname : datasets) {
            const auto *dsptr = find_dataset(dsname);
            if (dsptr == nullptr) {
                throw std::runtime_error("Invalid dataset specified in query");
            }
            datasets_to_query.emplace_back(dsptr);
        }
    }

    task->spec().estimate_work(datasets_to_query.size());

    QueryCounters counters;
    for (const auto *ds : datasets_to_query) {
        task->spec().add_progress(1);
        if (!ds->has_all_taints(taints)) {
            continue;
        }
        ds->execute(query, out, &counters);
    }
    return counters;
}